

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O2

int Omega_h::close(int __fd)

{
  Productions *v;
  int iVar1;
  int *piVar2;
  pointer piVar3;
  bool bVar4;
  int extraout_EAX;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  NodeEdges *pNVar9;
  ParserGraph *in_RCX;
  Grammar *in_RDX;
  vector<Omega_h::Config,_std::allocator<Omega_h::Config>_> *in_RSI;
  undefined4 in_register_0000003c;
  vector<int,std::allocator<int>> *pvVar10;
  int *piVar11;
  pointer piVar12;
  int config_i;
  Grammar *local_d0;
  vector<int,std::allocator<int>> *local_c8;
  ParserGraph *local_c0;
  vector<Omega_h::Config,_std::allocator<Omega_h::Config>_> *local_b8;
  set<int,_std::less<int>,_std::allocator<int>_> config_set;
  queue<int,_std::deque<int,_std::allocator<int>_>_> config_q;
  
  pvVar10 = (vector<int,std::allocator<int>> *)CONCAT44(in_register_0000003c,__fd);
  local_d0 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_RSI;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&config_q);
  config_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &config_set._M_t._M_impl.super__Rb_tree_header._M_header;
  config_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  config_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  config_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar11 = *(int **)pvVar10;
  piVar2 = *(int **)(pvVar10 + 8);
  config_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       config_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if (piVar11 == piVar2) {
      v = &local_d0->productions;
      local_c8 = pvVar10;
      while (config_q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             config_q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        iVar1 = *config_q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        std::deque<int,_std::allocator<int>_>::pop_front(&config_q.c);
        pvVar6 = at<Omega_h::Config>(local_b8,iVar1);
        pvVar7 = at<Omega_h::Grammar::Production>(v,pvVar6->production);
        if (pvVar6->dot !=
            (int)((ulong)((long)(pvVar7->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pvVar7->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
          pvVar8 = at<int>(&pvVar7->rhs,pvVar6->dot);
          iVar1 = *pvVar8;
          bVar4 = is_terminal(local_d0,iVar1);
          if (!bVar4) {
            pNVar9 = get_edges(local_c0,iVar1);
            piVar3 = (pNVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            for (piVar12 = (pNVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start; piVar12 != piVar3;
                piVar12 = piVar12 + 1) {
              config_i = *piVar12;
              sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                                (&config_set,&config_i);
              if (sVar5 == 0) {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&config_set,&config_i);
                std::deque<int,_std::allocator<int>_>::push_back(&config_q.c,&config_i);
              }
            }
          }
        }
      }
      std::vector<int,std::allocator<int>>::_M_assign_aux<std::_Rb_tree_const_iterator<int>>
                (local_c8,config_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 &config_set._M_t._M_impl.super__Rb_tree_header);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&config_set._M_t);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)&config_q);
      return extraout_EAX;
    }
    config_i = *piVar11;
    std::deque<int,_std::allocator<int>_>::push_back(&config_q.c,&config_i);
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&config_set,&config_i);
    if (sVar5 != 0) break;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &config_set,&config_i);
    piVar11 = piVar11 + 1;
  }
  fail("assertion %s failed at %s +%d\n","!config_set.count(config_i)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
       ,0x45);
}

Assistant:

static void close(StateInProgress& state, Configs const& cs,
    Grammar const& grammar, ParserGraph const& lhs2sc) {
  std::queue<int> config_q;
  std::set<int> config_set;
  for (auto config_i : state.configs) {
    config_q.push(config_i);
    OMEGA_H_CHECK(!config_set.count(config_i));
    config_set.insert(config_i);
  }
  while (!config_q.empty()) {
    auto config_i = config_q.front();
    config_q.pop();
    auto& config = at(cs, config_i);
    auto prod_i = config.production;
    auto& prod = at(grammar.productions, prod_i);
    if (config.dot == size(prod.rhs)) continue;
    auto symbol_after_dot = at(prod.rhs, config.dot);
    if (is_terminal(grammar, symbol_after_dot)) continue;
    for (auto sc : get_edges(lhs2sc, symbol_after_dot)) {
      if (!config_set.count(sc)) {
        config_set.insert(sc);
        config_q.push(sc);
      }
    }
  }
  state.configs.assign(config_set.begin(), config_set.end());
}